

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O2

int Llb_NonlinReachability(Llb_Mnn_t *p)

{
  DdManager *dd;
  int *pVar2Lev;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  DdNode *pDVar7;
  DdManager *pDVar8;
  abctime aVar9;
  abctime aVar10;
  DdNode *pDVar11;
  long lVar12;
  Gia_ParLlb_t *pGVar13;
  Abc_Cex_t *pAVar14;
  abctime time;
  abctime time_00;
  abctime time_01;
  ulong uVar15;
  int level;
  char *pcVar16;
  Llb_Mnn_t *pLVar17;
  uint uVar18;
  uint uVar19;
  double dVar20;
  double dVar21;
  uint local_44;
  
  aVar5 = Abc_Clock();
  if (p->pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1b2,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pGVar13 = p->pPars;
  iVar1 = pGVar13->TimeLimit;
  if ((long)iVar1 == 0) {
    aVar6 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    aVar6 = aVar6 + (long)iVar1 * 1000000;
    pGVar13 = p->pPars;
  }
  pGVar13->TimeTarget = aVar6;
  pDVar8 = p->dd;
  pDVar8->TimeStop = aVar6;
  p->ddG->TimeStop = aVar6;
  dd = p->ddR;
  dd->TimeStop = aVar6;
  if (pDVar8->bFunc != (DdNode *)0x0) {
    __assert_fail("p->dd->bFunc == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1bd,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pDVar7 = Llb_BddComputeBad(p->pInit,dd,aVar6);
  p->ddR->bFunc = pDVar7;
  if (pDVar7 != (DdNode *)0x0) {
    Cudd_Ref(pDVar7);
    Cudd_Quit(p->dd);
    pDVar8 = Llb_NonlinImageStart
                       (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,1,p->pPars->TimeTarget);
    p->dd = pDVar8;
    if (pDVar8 != (DdManager *)0x0) {
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,pDVar8);
      p->dd->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc = pDVar7;
      Cudd_Ref(pDVar7);
      pDVar7 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc2 = pDVar7;
      Cudd_Ref(pDVar7);
      uVar15 = (ulong)(uint)p->pPars->nIterMax;
      local_44 = 0xffffffff;
      uVar19 = 0xffffffff;
      do {
        uVar18 = uVar19;
        uVar19 = uVar18 + 1;
        if ((int)uVar15 <= (int)uVar19) {
LAB_0069afed:
          Llb_NonlinImageQuit();
          pGVar13 = p->pPars;
          if (pGVar13->fVerbose != 0) {
            dVar20 = Cudd_CountMinterm(p->ddG,p->ddG->bFunc,p->pAig->nRegs);
            if ((int)uVar19 < p->pPars->nIterMax) {
              pcVar16 = "Reachability analysis completed after %d frames.\n";
              if (p->pPars->nBddMax < (int)local_44) {
                pcVar16 = "Reachability analysis is stopped after %d frames.\n";
              }
            }
            else {
              pcVar16 = "Reachability analysis is stopped after %d frames.\n";
            }
            printf(pcVar16,(ulong)uVar19);
            dVar21 = ldexp(1.0,p->pAig->nRegs);
            printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar20,(dVar20 * 100.0) / dVar21);
            fflush(_stdout);
            pGVar13 = p->pPars;
          }
          iVar1 = pGVar13->nIterMax;
          if (((int)uVar19 < iVar1) && ((int)local_44 <= pGVar13->nBddMax)) {
            if (pGVar13->fSilent == 0) {
              printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar19);
              pGVar13 = p->pPars;
            }
            pGVar13->iFrame = uVar18;
            aVar6 = Abc_Clock();
            Abc_PrintTime(0x82525c,(char *)(aVar6 - aVar5),time_00);
            return 1;
          }
          if (pGVar13->fSilent == 0) {
            printf("Verified only for states reachable in %d frames.  ",(ulong)uVar19);
            pGVar13 = p->pPars;
            iVar1 = pGVar13->nIterMax;
          }
          pGVar13->iFrame = iVar1;
          return -1;
        }
        aVar6 = Abc_Clock();
        if (p->pPars->TimeLimit != 0) {
          aVar9 = Abc_Clock();
          pGVar13 = p->pPars;
          if (pGVar13->TimeTarget < aVar9) {
            if (pGVar13->fSilent == 0) {
              printf("Reached timeout (%d seconds) during image computation.\n",
                     (ulong)(uint)pGVar13->TimeLimit);
              pGVar13 = p->pPars;
            }
            pGVar13->iFrame = uVar18;
            goto LAB_0069b0aa;
          }
        }
        pDVar7 = Extra_TransferPermute(p->dd,p->ddR,p->dd->bFunc,p->vCs2Glo->pArray);
        if (pDVar7 == (DdNode *)0x0) {
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during ring transfer.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar18;
          goto LAB_0069b0aa;
        }
        Cudd_Ref(pDVar7);
        Vec_PtrPush(p->vRings,pDVar7);
        if (p->pPars->fSkipOutCheck == 0) {
          pDVar8 = p->ddR;
          iVar1 = Cudd_bddLeq(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
          level = (int)pDVar8;
          if (iVar1 == 0) {
            if (p->pInit->pSeqModel != (Abc_Cex_t *)0x0) {
              __assert_fail("p->pInit->pSeqModel == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                            ,0x1f5,"int Llb_NonlinReachability(Llb_Mnn_t *)");
            }
            pGVar13 = p->pPars;
            if (pGVar13->fBackward == 0) {
              pLVar17 = p;
              pAVar14 = Llb_NonlinDeriveCex(p);
              level = (int)pLVar17;
              p->pInit->pSeqModel = pAVar14;
              pGVar13 = p->pPars;
            }
            else {
              pAVar14 = (Abc_Cex_t *)0x0;
            }
            if (pGVar13->fSilent == 0) {
              if (pGVar13->fBackward == 0) {
                Abc_Print(level,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                          (ulong)(uint)pAVar14->iPo);
              }
              else {
                Abc_Print(level,
                          "Output ??? was asserted in frame %d (counter-example is not produced).  "
                          ,(ulong)(uVar18 + 1));
              }
              aVar6 = Abc_Clock();
              Abc_PrintTime(0x82525c,(char *)(aVar6 - aVar5),time_01);
              pGVar13 = p->pPars;
            }
            pGVar13->iFrame = uVar18;
            Llb_NonlinImageQuit();
            return 0;
          }
        }
        aVar9 = Abc_Clock();
        uVar2 = Cudd_DagSize(p->dd->bFunc);
        pDVar7 = Llb_NonlinImageCompute(p->dd->bFunc,p->pPars->fReorder,0,1,p->pOrderL);
        if (pDVar7 == (DdNode *)0x0) {
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in quantification.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar18;
          goto LAB_0069b0aa;
        }
        Cudd_Ref(pDVar7);
        local_44 = Cudd_DagSize(pDVar7);
        aVar10 = Abc_Clock();
        p->timeImage = p->timeImage + (aVar10 - aVar9);
        aVar9 = Abc_Clock();
        Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc2);
        pDVar11 = Extra_TransferPermute(p->dd,p->ddG,pDVar7,p->vNs2Glo->pArray);
        p->ddG->bFunc2 = pDVar11;
        if (pDVar11 == (DdNode *)0x0) {
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar18;
          pDVar8 = p->dd;
LAB_0069afb2:
          Cudd_RecursiveDeref(pDVar8,pDVar7);
          goto LAB_0069b0aa;
        }
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->dd,pDVar7);
        aVar10 = Abc_Clock();
        p->timeTran1 = p->timeTran1 + (aVar10 - aVar9);
        pDVar8 = p->dd;
        pVar2Lev = p->pOrderL2;
        uVar3 = Llb_NonlinCompPerms(pDVar8,pVar2Lev);
        memcpy(pVar2Lev,pDVar8->perm,(long)pDVar8->size << 2);
        lVar12 = Cudd_ReadReorderingTime(p->dd);
        p->timeReo = p->timeReo + lVar12;
        iVar1 = Cudd_ReadReorderings(p->dd);
        p->ddLocReos = p->ddLocReos + iVar1;
        iVar1 = Cudd_ReadGarbageCollections(p->dd);
        p->ddLocGrbs = p->ddLocGrbs + iVar1;
        Llb_NonlinImageQuit();
        pDVar8 = Llb_NonlinImageStart
                           (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,0,
                            p->pPars->TimeTarget);
        p->dd = pDVar8;
        if (pDVar8 == (DdManager *)0x0) {
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar18;
          return -1;
        }
        aVar9 = Abc_Clock();
        pDVar8 = p->ddG;
        pDVar7 = pDVar8->bFunc2;
        pDVar11 = Cudd_bddAnd(pDVar8,pDVar7,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
        pDVar8 = p->ddG;
        pDVar8->bFunc2 = pDVar11;
        if (pDVar11 == (DdNode *)0x0) {
LAB_0069aefc:
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
            pDVar8 = p->ddG;
          }
          pGVar13->iFrame = uVar18;
          goto LAB_0069afb2;
        }
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->ddG,pDVar7);
        aVar10 = Abc_Clock();
        p->timeGloba = p->timeGloba + (aVar10 - aVar9);
        if (*(int *)((ulong)p->ddG->bFunc2 & 0xfffffffffffffffe) == 0x7fffffff) goto LAB_0069afed;
        aVar9 = Abc_Clock();
        pDVar8 = p->ddG;
        pDVar7 = pDVar8->bFunc;
        pDVar11 = Cudd_bddOr(pDVar8,pDVar7,pDVar8->bFunc2);
        pDVar8 = p->ddG;
        pDVar8->bFunc = pDVar11;
        if (pDVar11 == (DdNode *)0x0) goto LAB_0069aefc;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->ddG,pDVar7);
        aVar10 = Abc_Clock();
        p->timeGloba = p->timeGloba + (aVar10 - aVar9);
        aVar9 = Abc_Clock();
        pDVar7 = Extra_TransferPermute(p->ddG,p->dd,p->ddG->bFunc2,p->vGlo2Cs->pArray);
        p->dd->bFunc = pDVar7;
        if (pDVar7 == (DdNode *)0x0) {
          pGVar13 = p->pPars;
          if (pGVar13->fSilent != 0) goto LAB_0069b085;
          uVar15 = (ulong)(uint)pGVar13->TimeLimit;
          pcVar16 = "Reached timeout (%d seconds) during image computation in transfer 2.\n";
          goto LAB_0069b07a;
        }
        Cudd_Ref(pDVar7);
        aVar10 = Abc_Clock();
        p->timeTran2 = p->timeTran2 + (aVar10 - aVar9);
        pGVar13 = p->pPars;
        if (pGVar13->fVerbose != 0) {
          printf("I =%3d : ",(ulong)uVar19);
          printf("Fr =%7d ",(ulong)uVar2);
          printf("Im =%7d  ",(ulong)local_44);
          printf("(%4d %4d)  ",(ulong)(uint)p->ddLocReos,(ulong)(uint)p->ddLocGrbs);
          uVar2 = Cudd_DagSize(p->ddG->bFunc);
          printf("Rea =%6d  ",(ulong)uVar2);
          uVar2 = Cudd_ReadReorderings(p->ddG);
          uVar4 = Cudd_ReadGarbageCollections(p->ddG);
          printf("(%4d %4d)  ",(ulong)uVar2,(ulong)uVar4);
          printf("S =%4d ",(ulong)(uint)nSuppMax);
          printf("cL =%5d ",(ulong)uVar3);
          uVar2 = Llb_NonlinCompPerms(p->ddG,p->pOrderG);
          printf("cG =%5d ",(ulong)uVar2);
          aVar9 = Abc_Clock();
          Abc_PrintTime(0x8be0bf,(char *)(aVar9 - aVar6),time);
          memcpy(p->pOrderG,p->ddG->perm,(long)p->ddG->size << 2);
          pGVar13 = p->pPars;
        }
        uVar15 = (ulong)(uint)pGVar13->nIterMax;
        if (uVar19 == pGVar13->nIterMax - 1U) {
          uVar18 = uVar18 + 1;
          if (pGVar13->fSilent == 0) {
            pcVar16 = "Reached limit on the number of timeframes (%d).\n";
LAB_0069b07a:
            printf(pcVar16,uVar15);
            pGVar13 = p->pPars;
          }
LAB_0069b085:
          pGVar13->iFrame = uVar18;
LAB_0069b0aa:
          Llb_NonlinImageQuit();
          return -1;
        }
      } while( true );
    }
  }
  pGVar13 = p->pPars;
  if (pGVar13->fSilent == 0) {
    printf("Reached timeout (%d seconds) during constructing the bad states.\n",
           (ulong)(uint)pGVar13->TimeLimit);
    pGVar13 = p->pPars;
  }
  pGVar13->iFrame = -1;
  return -1;
}

Assistant:

int Llb_NonlinReachability( Llb_Mnn_t * p )
{ 
    DdNode * bTemp, * bNext;
    int nIters, nBddSize0, nBddSize = -1, NumCmp;//, Limit = p->pPars->nBddMax;
    abctime clk2, clk3, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // set reordering hooks
    assert( p->dd->bFunc == NULL );
//    p->dd->bFunc = (DdNode *)p->pAig;
//    Cudd_AddHook( p->dd, Llb_NonlinReoHook, CUDD_POST_REORDERING_HOOK );

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );
    // compute the starting set of states
    Cudd_Quit( p->dd );
    p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 1, p->pPars->TimeTarget );
    if ( p->dd == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    p->dd->bFunc   = Llb_NonlinComputeInitState( p->pAig, p->dd );   Cudd_Ref( p->dd->bFunc );   // current
    p->ddG->bFunc  = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc );  // reached
    p->ddG->bFunc2 = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc2 ); // frontier 
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        clk2 = Abc_Clock();
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, p->dd->bFunc, Vec_IntArray(p->vCs2Glo) );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_NonlinDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return 0;
        }

        // compute the next states
        clk3 = Abc_Clock();
        nBddSize0 = Cudd_DagSize( p->dd->bFunc );
        bNext = Llb_NonlinImageCompute( p->dd->bFunc, p->pPars->fReorder, 0, 1, p->pOrderL ); // consumes ref   
//        bNext = Llb_NonlinImage( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->dd, bCurrent, 
//            p->pPars->fReorder, p->pPars->fVeryVerbose, NULL, ABC_INFINITY, p->pPars->TimeTarget );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bNext );
        nBddSize = Cudd_DagSize( bNext );
        p->timeImage += Abc_Clock() - clk3;


        // transfer to the state manager
        clk3 = Abc_Clock();
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
        p->ddG->bFunc2 = Extra_TransferPermute( p->dd, p->ddG, bNext, Vec_IntArray(p->vNs2Glo) );    
//        p->ddG->bFunc2 = Extra_bddAndPermute( p->ddG, Cudd_Not(p->ddG->bFunc), p->dd, bNext, Vec_IntArray(p->vNs2Glo) );    
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bNext );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->dd, bNext );
        p->timeTran1 += Abc_Clock() - clk3;

        // save permutation
        NumCmp = Llb_NonlinCompPerms( p->dd, p->pOrderL2 );
        // save order before image computation
        memcpy( p->pOrderL2, p->dd->perm, sizeof(int) * p->dd->size );
        // update the image computation manager
        p->timeReo   += Cudd_ReadReorderingTime(p->dd);
        p->ddLocReos += Cudd_ReadReorderings(p->dd);
        p->ddLocGrbs += Cudd_ReadGarbageCollections(p->dd);
        Llb_NonlinImageQuit();
        p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 0, p->pPars->TimeTarget );
        if ( p->dd == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        //Extra_TestAndPerm( p->ddG, Cudd_Not(p->ddG->bFunc), p->ddG->bFunc2 );    

        // derive new states
        clk3 = Abc_Clock();
        p->ddG->bFunc2 = Cudd_bddAnd( p->ddG, bTemp = p->ddG->bFunc2, Cudd_Not(p->ddG->bFunc) );     
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        if ( Cudd_IsConstant(p->ddG->bFunc2) )
            break;
        // add to the reached set
        clk3 = Abc_Clock();
        p->ddG->bFunc = Cudd_bddOr( p->ddG, bTemp = p->ddG->bFunc, p->ddG->bFunc2 );                 
        if ( p->ddG->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        // reset permutation
//        RetValue = Cudd_CheckZeroRef( dd );
//        assert( RetValue == 0 );
//        Cudd_ShuffleHeap( dd, pOrderG );

        // move new states to the working manager
        clk3 = Abc_Clock();
        p->dd->bFunc = Extra_TransferPermute( p->ddG, p->dd, p->ddG->bFunc2, Vec_IntArray(p->vGlo2Cs) ); 
        if ( p->dd->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->dd->bFunc );
        p->timeTran2 += Abc_Clock() - clk3;

        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%3d : ",   nIters );
            printf( "Fr =%7d ",    nBddSize0 );
            printf( "Im =%7d  ",   nBddSize );
            printf( "(%4d %4d)  ", p->ddLocReos, p->ddLocGrbs );
            printf( "Rea =%6d  ",  Cudd_DagSize(p->ddG->bFunc) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            printf( "S =%4d ",     nSuppMax );
            printf( "cL =%5d ",    NumCmp );
            printf( "cG =%5d ",    Llb_NonlinCompPerms( p->ddG, p->pOrderG ) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clk2 );
            memcpy( p->pOrderG, p->ddG->perm, sizeof(int) * p->ddG->size );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(ddG, bReached, Saig_ManRegNum(pAig) );
//            Extra_bddPrint( ddG, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Llb_NonlinImageQuit();
            return -1;
        }
    }
    Llb_NonlinImageQuit();
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, p->ddG->bFunc, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1; // unreachable
}